

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O2

bool TestCompressionF<Counter<unsigned_int,32u>,Counter<unsigned_char,8u>>(int bias)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint absDiff;
  uint original;
  uint uVar4;
  uint uVar5;
  uint recent;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  iVar1 = 0;
  for (uVar4 = 0; uVar4 != 0x200; uVar4 = uVar4 + 1) {
    uVar5 = uVar4 & 0xff;
    uVar7 = uVar4;
    for (uVar6 = 0; uVar6 != 0x200; uVar6 = uVar6 + 1) {
      if (uVar6 < uVar4) {
        if ((int)uVar7 < (int)(0x80U - bias)) {
LAB_00102158:
          uVar8 = uVar6 & 0x100 | uVar5;
          uVar2 = uVar6 & 0xff;
          if (uVar2 < uVar5) {
            uVar3 = uVar8 - 0x100;
            if (uVar5 - uVar2 < 0x80U - bias) {
              uVar3 = uVar8;
            }
          }
          else {
            uVar3 = uVar8 + 0x100;
            if (uVar2 - uVar5 <= bias + 0x80U) {
              uVar3 = uVar8;
            }
          }
          if ((uVar3 != uVar4) || ((bias == 0 && (uVar4 - (int)(char)uVar7 != uVar6))))
          goto LAB_001021b8;
        }
      }
      else if ((int)(iVar1 + uVar6) <= (int)(bias + 0x80U)) goto LAB_00102158;
      uVar7 = uVar7 - 1;
    }
    iVar1 = iVar1 + -1;
  }
LAB_001021b8:
  return 0x1ff < uVar4;
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}